

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3SchemaToIndex(sqlite3 *db,Schema *pSchema)

{
  Schema *pSVar1;
  int iVar2;
  Schema **ppSVar3;
  
  if (pSchema != (Schema *)0x0) {
    iVar2 = -1;
    ppSVar3 = &db->aDb->pSchema;
    do {
      iVar2 = iVar2 + 1;
      pSVar1 = *ppSVar3;
      ppSVar3 = ppSVar3 + 4;
    } while (pSVar1 != pSchema);
    return iVar2;
  }
  return -1000000;
}

Assistant:

SQLITE_PRIVATE int sqlite3SchemaToIndex(sqlite3 *db, Schema *pSchema){
  int i = -1000000;

  /* If pSchema is NULL, then return -1000000. This happens when code in 
  ** expr.c is trying to resolve a reference to a transient table (i.e. one
  ** created by a sub-select). In this case the return value of this 
  ** function should never be used.
  **
  ** We return -1000000 instead of the more usual -1 simply because using
  ** -1000000 as the incorrect index into db->aDb[] is much 
  ** more likely to cause a segfault than -1 (of course there are assert()
  ** statements too, but it never hurts to play the odds).
  */
  assert( sqlite3_mutex_held(db->mutex) );
  if( pSchema ){
    for(i=0; 1; i++){
      assert( i<db->nDb );
      if( db->aDb[i].pSchema==pSchema ){
        break;
      }
    }
    assert( i>=0 && i<db->nDb );
  }
  return i;
}